

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O3

void __thiscall
Atari2600::TIA::Player::dequeue_pixels
          (Player *this,uint8_t *target,uint8_t collision_identity,int time_now)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar5 = this->queue_read_pointer_;
  do {
    if (uVar5 == this->queue_write_pointer_) {
      return;
    }
    lVar8 = (long)(int)uVar5;
    iVar1 = this->queue_[lVar8].start;
    iVar2 = this->queue_[lVar8].end;
    uVar7 = this->queue_[lVar8].pixel_position;
    iVar6 = this->queue_[lVar8].adder;
    uVar3 = this->queue_[lVar8].reverse_mask;
    if (time_now < iVar2) {
      uVar11 = time_now - iVar1;
      uVar10 = 0x20;
      if (((uVar7 != 0x20) && (uVar10 = uVar7, this->graphic[this->graphic_index] != '\0')) &&
         (0 < (int)uVar11 && (int)uVar7 < 0x20)) {
        uVar9 = 1;
        do {
          bVar4 = collision_identity;
          if ((this->graphic[this->graphic_index] >> ((uVar7 >> 2 ^ uVar3) & 0x1f) & 1) == 0) {
            bVar4 = 0;
          }
          target[uVar9 + (long)iVar1 + -1] = target[uVar9 + (long)iVar1 + -1] | bVar4;
          uVar7 = uVar7 + iVar6;
        } while (((int)uVar7 < 0x20) && (bVar12 = uVar9 < uVar11, uVar9 = uVar9 + 1, bVar12));
        uVar5 = this->queue_read_pointer_;
        lVar8 = (long)(int)uVar5;
        iVar6 = this->queue_[lVar8].adder;
        uVar10 = this->queue_[lVar8].pixel_position;
      }
      this->queue_[lVar8].pixel_position = iVar6 * uVar11 + uVar10;
      this->queue_[lVar8].start = time_now;
    }
    else {
      if (((uVar7 != 0x20) && (this->graphic[this->graphic_index] != '\0')) &&
         (0 < iVar2 - iVar1 && (int)uVar7 < 0x20)) {
        uVar9 = 1;
        do {
          bVar4 = collision_identity;
          if ((this->graphic[this->graphic_index] >> ((uVar7 >> 2 ^ uVar3) & 0x1f) & 1) == 0) {
            bVar4 = 0;
          }
          target[uVar9 + (long)iVar1 + -1] = target[uVar9 + (long)iVar1 + -1] | bVar4;
          uVar7 = uVar7 + iVar6;
        } while (((int)uVar7 < 0x20) &&
                (bVar12 = uVar9 < (uint)(iVar2 - iVar1), uVar9 = uVar9 + 1, bVar12));
        uVar5 = this->queue_read_pointer_;
      }
      uVar5 = uVar5 + 1 & 3;
      this->queue_read_pointer_ = uVar5;
    }
  } while (iVar2 <= time_now);
  return;
}

Assistant:

void dequeue_pixels(uint8_t *const target, const uint8_t collision_identity, const int time_now) {
				while(queue_read_pointer_ != queue_write_pointer_) {
					uint8_t *const start_ptr = &target[queue_[queue_read_pointer_].start];
					if(queue_[queue_read_pointer_].end > time_now) {
						const int length = time_now - queue_[queue_read_pointer_].start;
						output_pixels(start_ptr, length, collision_identity, queue_[queue_read_pointer_].pixel_position, queue_[queue_read_pointer_].adder, queue_[queue_read_pointer_].reverse_mask);
						queue_[queue_read_pointer_].pixel_position += length * queue_[queue_read_pointer_].adder;
						queue_[queue_read_pointer_].start = time_now;
						return;
					} else {
						output_pixels(start_ptr, queue_[queue_read_pointer_].end - queue_[queue_read_pointer_].start, collision_identity, queue_[queue_read_pointer_].pixel_position, queue_[queue_read_pointer_].adder, queue_[queue_read_pointer_].reverse_mask);
					}
					queue_read_pointer_ = (queue_read_pointer_ + 1)&3;
				}
			}